

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp.c
# Opt level: O3

ptr_ll * cpp_readAndLineBreak(FILE *file)

{
  ulong uVar1;
  char *pcVar2;
  ptr_ll *ll;
  
  fseek((FILE *)file,0,2);
  uVar1 = ftell((FILE *)file);
  fseek((FILE *)file,0,0);
  pcVar2 = (char *)calloc((ulong)((int)uVar1 + 1),1);
  fread(pcVar2,1,uVar1 & 0xffffffff,(FILE *)file);
  fclose((FILE *)file);
  pcVar2[uVar1 & 0xffffffff] = '\0';
  pcVar2 = strtok(pcVar2,"\n");
  ll = (ptr_ll *)calloc(1,0x18);
  while (pcVar2 != (char *)0x0) {
    ptr_ll_add(ll,pcVar2);
    pcVar2 = strtok((char *)0x0,"\n");
  }
  return ll;
}

Assistant:

struct ptr_ll* cpp_readAndLineBreak(FILE *file) {
    fseek(file, 0, SEEK_END);
    unsigned size = ftell(file);
    fseek(file, 0, SEEK_SET);
    char *buf = calloc(size+1,1); // We may not need the +1, but it's there in case we do
    fread(buf, 1, size, file);
    fclose(file);
    buf[size] = 0; // Just in case.
    char *curLine = strtok(buf, "\n");
    struct ptr_ll *lines = calloc(1, sizeof(struct ptr_ll));
    while(curLine) {
        ptr_ll_add(lines, curLine);
        curLine = strtok(NULL, "\n"); // Keep "tokenizing" the same string
    }
    return lines;
}